

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *this)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  unsigned_long uVar4;
  bool bVar5;
  ulong uVar6;
  
  bVar5 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (((this->all_invalid != false) ||
      (bVar1 = hugeint_t::operator==(&this->maximum,&this->minimum), bVar1)) &&
     ((byte)(this->mode - AUTO) < 2)) {
    this->total_size = this->total_size + 0x14;
    return true;
  }
  bVar1 = TrySubtractOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (this->maximum,this->minimum,&this->min_max_diff);
  this->can_do_for = bVar1;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    bVar1 = hugeint_t::operator==(&this->maximum_delta,&this->minimum_delta);
    if ((bVar1) && ((this->mode & ~AUTO) != DELTA_FOR)) {
      this->total_size = this->total_size + 0x24;
      return true;
    }
    bVar2 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,false,false>
                      (this->min_max_delta_diff,this->min_max_delta_diff);
    bVar3 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,true,false>
                      (this->min_max_diff,this->min_max_diff);
    bVar1 = this->mode != FOR;
    if (bVar1 && bVar2 < bVar3) {
      SubtractFrameOfReference<duckdb::hugeint_t>(this,this->delta_buffer,this->minimum_delta);
      this->total_size = this->total_size + 0x28;
      uVar6 = this->compression_buffer_idx;
      if ((uVar6 & 0x1f) != 0) {
        uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
        uVar6 = (uVar6 - uVar4) + 0x20;
      }
      this->total_size = this->total_size + (bVar2 * uVar6 >> 3);
      if (bVar1 && bVar2 < bVar3) {
        return true;
      }
    }
  }
  if (this->can_do_for == true) {
    bVar2 = BitpackingPrimitives::FindMinimumBitWidth<duckdb::hugeint_t,false,false>
                      (this->min_max_diff,this->min_max_diff);
    SubtractFrameOfReference<duckdb::hugeint_t>(this,this->compression_buffer,this->minimum);
    uVar6 = this->compression_buffer_idx;
    if ((uVar6 & 0x1f) != 0) {
      uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar6 & 0x1f);
      uVar6 = (uVar6 - uVar4) + 0x20;
    }
    this->total_size = (bVar2 * uVar6 >> 3) + this->total_size + 0x18;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}